

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

opj_image_t * pgxtoimage(char *filename,opj_cparameters_t *parameters)

{
  opj_image_comp_t *poVar1;
  bool bVar2;
  byte bVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  OPJ_UINT32 OVar7;
  FILE *__stream;
  long lVar8;
  size_t sVar9;
  sbyte sVar10;
  ulong uVar11;
  ulong uVar12;
  char cVar13;
  uint uVar14;
  char *pcVar15;
  char ch;
  char endian2;
  char endian1;
  int h;
  int w;
  int local_bc;
  int prec;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uint local_88;
  opj_image_t *local_80;
  char temp [32];
  char signtmp [32];
  
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !\n",filename);
    return (opj_image_t *)0x0;
  }
  fseek(__stream,0,0);
  pcVar15 = signtmp;
  iVar5 = __isoc99_fscanf(__stream,"PG%31[ \t]%c%c%31[ \t+-]%d%31[ \t]%d%31[ \t]%d",temp,&endian1,
                          &endian2,pcVar15,&prec,temp,&w,temp,&h);
  if (iVar5 != 9) {
    pgxtoimage_cold_1();
    return (opj_image_t *)0x0;
  }
  cVar13 = '+';
  do {
    if (*pcVar15 == '-') {
      cVar13 = '-';
    }
    else if (*pcVar15 == '\0') {
      fgetc(__stream);
      local_bc = 1;
      if ((endian2 != 'L' || endian1 != 'M') && ((endian1 != 'L' || (local_bc = 0, endian2 != 'M')))
         ) {
        pgxtoimage_cold_2();
        return (opj_image_t *)0x0;
      }
      if (((long)w < 1) || ((h < 1 || (prec - 0x20U < 0xffffffe1)))) {
        pgxtoimage_cold_4();
        return (opj_image_t *)0x0;
      }
      sVar10 = 2;
      if ((uint)prec < 0x11) {
        sVar10 = 8 < (uint)prec;
      }
      uVar12 = (ulong)(uint)h * (long)w << sVar10;
      if (10000000 < uVar12) {
        lVar8 = ftell(__stream);
        uVar11 = 0x7fffffff;
        if (uVar12 < 0x7fffffff) {
          uVar11 = uVar12;
        }
        fseek(__stream,uVar11 - 1,0);
        sVar9 = fread(&ch,1,1,__stream);
        if (sVar9 != 1) {
          pgxtoimage_cold_3();
          return (opj_image_t *)0x0;
        }
        fseek(__stream,lVar8,0);
      }
      iVar5 = prec;
      local_98._0_4_ = parameters->image_offset_x0;
      local_98._4_4_ = parameters->image_offset_y0;
      uStack_a0._0_4_ = parameters->image_offset_x0 + (w + -1) * parameters->subsampling_dx + 1;
      local_a8._0_4_ = parameters->subsampling_dx;
      local_a8._4_4_ = parameters->subsampling_dy;
      uStack_a0._4_4_ = (h + -1) * parameters->subsampling_dy + parameters->image_offset_y0 + 1;
      local_88 = (uint)(cVar13 == '-');
      local_b0 = 0;
      local_ac = 0;
      local_b4 = 0;
      if (prec < 8) {
        local_ac = 8 - prec;
        local_b4 = prec - local_ac;
        local_b0 = 1 << ((char)prec - 1U & 0x1f);
        if (cVar13 != '-') {
          local_b0 = 0;
        }
        local_88 = 0;
        prec = 8;
      }
      uStack_90 = CONCAT44(prec,prec);
      local_80 = (opj_image_t *)opj_image_create(1,&local_a8,2);
      if (local_80 == (opj_image_t *)0x0) {
        fclose(__stream);
        return (opj_image_t *)0x0;
      }
      local_80->x0 = (OPJ_UINT32)local_98;
      local_80->y0 = (OPJ_UINT32)local_98;
      local_80->x1 = (OPJ_UINT32)uStack_a0;
      local_80->y1 = uStack_a0._4_4_;
      poVar1 = local_80->comps;
      if (h * w < 1) {
        fclose(__stream);
        OVar7 = 1;
      }
      else {
        lVar8 = 0;
        uVar14 = 0;
        do {
          if (iVar5 < 8) {
            bVar3 = readuchar((FILE *)__stream);
            uVar6 = ((uint)bVar3 + local_b0 >> ((byte)local_b4 & 0x1f)) +
                    ((uint)bVar3 + local_b0 << ((byte)local_ac & 0x1f));
            poVar1->data[lVar8] = uVar6 & 0xff;
            if ((int)uVar14 < (int)uVar6) {
              uVar14 = uVar6;
            }
          }
          else {
            if (poVar1->prec == 8) {
              OVar7 = poVar1->sgnd;
              bVar3 = readuchar((FILE *)__stream);
              if (OVar7 == 0) {
                uVar6 = (uint)bVar3;
              }
              else {
                uVar6 = (uint)(char)bVar3;
              }
            }
            else if (poVar1->prec < 0x11) {
              OVar7 = poVar1->sgnd;
              uVar4 = readushort((FILE *)__stream,local_bc);
              if (OVar7 == 0) {
                uVar6 = (uint)uVar4;
              }
              else {
                uVar6 = (uint)(short)uVar4;
              }
            }
            else {
              uVar6 = readuint((FILE *)__stream,local_bc);
            }
            if ((int)uVar14 < (int)uVar6) {
              uVar14 = uVar6;
            }
            poVar1->data[lVar8] = uVar6;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (long)h * (long)w);
        fclose(__stream);
        OVar7 = 1;
        if (1 < (int)uVar14) {
          uVar12 = (ulong)uVar14;
          do {
            uVar12 = uVar12 >> 1;
            OVar7 = OVar7 + 1;
            bVar2 = 3 < uVar14;
            uVar14 = (uint)uVar12;
          } while (bVar2);
        }
      }
      poVar1->bpp = OVar7;
      return local_80;
    }
    pcVar15 = pcVar15 + 1;
  } while( true );
}

Assistant:

opj_image_t* pgxtoimage(const char *filename, opj_cparameters_t *parameters)
{
    FILE *f = NULL;
    int w, h, prec;
    int i, numcomps, max;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t cmptparm;  /* maximum of 1 component  */
    opj_image_t * image = NULL;
    int adjustS, ushift, dshift, force8;
    OPJ_UINT64 expected_file_size;

    char endian1, endian2, sign;
    char signtmp[32];

    char temp[32];
    int bigendian;
    opj_image_comp_t *comp = NULL;

    numcomps = 1;
    color_space = OPJ_CLRSPC_GRAY;

    memset(&cmptparm, 0, sizeof(opj_image_cmptparm_t));

    max = 0;

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !\n", filename);
        return NULL;
    }

    fseek(f, 0, SEEK_SET);
    if (fscanf(f, "PG%31[ \t]%c%c%31[ \t+-]%d%31[ \t]%d%31[ \t]%d", temp, &endian1,
               &endian2, signtmp, &prec, temp, &w, temp, &h) != 9) {
        fclose(f);
        fprintf(stderr,
                "ERROR: Failed to read the right number of element from the fscanf() function!\n");
        return NULL;
    }

    i = 0;
    sign = '+';
    while (signtmp[i] != '\0') {
        if (signtmp[i] == '-') {
            sign = '-';
        }
        i++;
    }

    fgetc(f);
    if (endian1 == 'M' && endian2 == 'L') {
        bigendian = 1;
    } else if (endian2 == 'M' && endian1 == 'L') {
        bigendian = 0;
    } else {
        fclose(f);
        fprintf(stderr, "Bad pgx header, please check input file\n");
        return NULL;
    }

    if (w < 1 || h < 1 || prec < 1 || prec > 31) {
        fclose(f);
        fprintf(stderr, "Bad pgx header, please check input file\n");
        return NULL;
    }

    expected_file_size =
        (OPJ_UINT64)w * (OPJ_UINT64)h * (prec > 16 ? 4 : prec > 8 ? 2 : 1);
    if (expected_file_size > 10000000U) {
        char ch;
        long curpos = ftell(f);
        if (expected_file_size > (OPJ_UINT64)INT_MAX) {
            expected_file_size = (OPJ_UINT64)INT_MAX;
        }
        fseek(f, (long)expected_file_size - 1, SEEK_SET);
        if (fread(&ch, 1, 1, f) != 1) {
            fprintf(stderr, "File too short\n");
            fclose(f);
            return NULL;
        }
        fseek(f, curpos, SEEK_SET);
    }

    /* initialize image component */

    cmptparm.x0 = (OPJ_UINT32)parameters->image_offset_x0;
    cmptparm.y0 = (OPJ_UINT32)parameters->image_offset_y0;
    cmptparm.w = !cmptparm.x0 ? (OPJ_UINT32)((w - 1) * parameters->subsampling_dx +
                 1) : cmptparm.x0 + (OPJ_UINT32)(w - 1) * (OPJ_UINT32)parameters->subsampling_dx
                 + 1;
    cmptparm.h = !cmptparm.y0 ? (OPJ_UINT32)((h - 1) * parameters->subsampling_dy +
                 1) : cmptparm.y0 + (OPJ_UINT32)(h - 1) * (OPJ_UINT32)parameters->subsampling_dy
                 + 1;

    if (sign == '-') {
        cmptparm.sgnd = 1;
    } else {
        cmptparm.sgnd = 0;
    }
    if (prec < 8) {
        force8 = 1;
        ushift = 8 - prec;
        dshift = prec - ushift;
        if (cmptparm.sgnd) {
            adjustS = (1 << (prec - 1));
        } else {
            adjustS = 0;
        }
        cmptparm.sgnd = 0;
        prec = 8;
    } else {
        ushift = dshift = force8 = adjustS = 0;
    }

    cmptparm.prec = (OPJ_UINT32)prec;
    cmptparm.bpp = (OPJ_UINT32)prec;
    cmptparm.dx = (OPJ_UINT32)parameters->subsampling_dx;
    cmptparm.dy = (OPJ_UINT32)parameters->subsampling_dy;

    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm, color_space);
    if (!image) {
        fclose(f);
        return NULL;
    }
    /* set image offset and reference grid */
    image->x0 = cmptparm.x0;
    image->y0 = cmptparm.x0;
    image->x1 = cmptparm.w;
    image->y1 = cmptparm.h;

    /* set image data */

    comp = &image->comps[0];

    for (i = 0; i < w * h; i++) {
        int v;
        if (force8) {
            v = readuchar(f) + adjustS;
            v = (v << ushift) + (v >> dshift);
            comp->data[i] = (unsigned char)v;

            if (v > max) {
                max = v;
            }

            continue;
        }
        if (comp->prec == 8) {
            if (!comp->sgnd) {
                v = readuchar(f);
            } else {
                v = (char) readuchar(f);
            }
        } else if (comp->prec <= 16) {
            if (!comp->sgnd) {
                v = readushort(f, bigendian);
            } else {
                v = (short) readushort(f, bigendian);
            }
        } else {
            if (!comp->sgnd) {
                v = (int)readuint(f, bigendian);
            } else {
                v = (int) readuint(f, bigendian);
            }
        }
        if (v > max) {
            max = v;
        }
        comp->data[i] = v;
    }
    fclose(f);
    comp->bpp = (OPJ_UINT32)int_floorlog2(max) + 1;

    return image;
}